

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

_Bool xfer_download_data(fxp_xfer *xfer,void **buf,int *len)

{
  req *ptr;
  req *prVar1;
  req **pprVar2;
  int iVar3;
  char *pcVar4;
  
  pcVar4 = (char *)0x0;
  iVar3 = 0;
  while (((ptr = xfer->head, ptr != (req *)0x0 && (ptr->complete != 0)) && (pcVar4 == (char *)0x0)))
  {
    if (ptr->complete < 1) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = ptr->buffer;
      iVar3 = ptr->retlen;
    }
    prVar1 = ptr->next;
    pprVar2 = &prVar1->prev;
    if (prVar1 == (req *)0x0) {
      pprVar2 = &xfer->tail;
    }
    xfer->head = prVar1;
    *pprVar2 = (req *)0x0;
    xfer->req_totalsize = xfer->req_totalsize - ptr->len;
    safefree(ptr);
  }
  if (pcVar4 != (char *)0x0) {
    *buf = pcVar4;
    *len = iVar3;
  }
  return pcVar4 != (char *)0x0;
}

Assistant:

bool xfer_download_data(struct fxp_xfer *xfer, void **buf, int *len)
{
    void *retbuf = NULL;
    int retlen = 0;

    /*
     * Discard anything at the head of the rr queue with complete <
     * 0; return the first thing with complete > 0.
     */
    while (xfer->head && xfer->head->complete && !retbuf) {
        struct req *rr = xfer->head;

        if (rr->complete > 0) {
            retbuf = rr->buffer;
            retlen = rr->retlen;
#ifdef DEBUG_DOWNLOAD
            printf("handing back data from read request %p\n", rr);
#endif
        }
#ifdef DEBUG_DOWNLOAD
        else
            printf("skipping failed read request %p\n", rr);
#endif

        xfer->head = xfer->head->next;
        if (xfer->head)
            xfer->head->prev = NULL;
        else
            xfer->tail = NULL;
        xfer->req_totalsize -= rr->len;
        sfree(rr);
    }

    if (retbuf) {
        *buf = retbuf;
        *len = retlen;
        return true;
    } else
        return false;
}